

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O1

int re_sbuff(CharBuff *buff,uint new_size)

{
  char *__src;
  char *__s;
  uint uVar1;
  
  uVar1 = buff->buff_size * 2;
  if (buff->buff_size < new_size) {
    uVar1 = new_size;
  }
  uVar1 = uVar1 + 1;
  buff->buff_size = uVar1;
  __src = buff->body;
  __s = (char *)malloc((ulong)uVar1);
  memset(__s,0,(ulong)uVar1);
  if (__s != (char *)0x0) {
    memcpy(__s,__src,(ulong)buff->len);
    buff->body = __s;
    free(__src);
  }
  return (uint)(__s != (char *)0x0);
}

Assistant:

int re_sbuff(CharBuff* buff, unsigned int new_size){
    if (new_size <= buff->buff_size){
        new_size = buff->buff_size * 2;
    }
    new_size = MALLOC_SIZE(char, +new_size);
    buff->buff_size = new_size;
    char* old_buff = buff->body;
    char* new_buff = malloc(new_size);
    buff_zero(new_buff, new_size);
    if (new_buff == NULL)return false;
    buff->body = memcpy(new_buff, buff->body, buff->len);
    free(old_buff);
    return true;
}